

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_get_format(coda_type *type,coda_format *format)

{
  undefined8 uVar1;
  char *message;
  
  if (type == (coda_type *)0x0) {
    message = "type argument is NULL (%s:%u)";
    uVar1 = 0xb16;
  }
  else {
    if (format != (coda_format *)0x0) {
      *format = type->format;
      return 0;
    }
    message = "format argument is NULL (%s:%u)";
    uVar1 = 0xb1b;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar1);
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_format(const coda_type *type, coda_format *format)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *format = type->format;
    return 0;
}